

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerator.cpp
# Opt level: O0

CodeGenerator * __thiscall CodeGenerator::generate_c_code_abi_cxx11_(CodeGenerator *this)

{
  string local_40 [39];
  undefined1 local_19;
  CodeGenerator *this_local;
  string *code;
  
  local_19 = 0;
  this_local = this;
  std::operator+((char *)local_40,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "// Generated by program-homework-solver\n\n#include <stdio.h>\n\nint f(int x){\n\tint answer = "
                );
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (char *)local_40);
  std::__cxx11::string::~string(local_40);
  return this;
}

Assistant:

string CodeGenerator::generate_c_code() {
    string code =
            "// Generated by program-homework-solver\n\n"
            "#include <stdio.h>"
            "\n\n"
            "int f(int x){\n"
            "\tint answer = " + CodeGenerator::func + ";\n"
            "\treturn answer;\n"
            "}\n\n"
            "void main(){"
            "\n\n"
            "\tfor(int i=0; i<20; i++){\n"
            "\t\tprintf(\"%d \",f(i));\n"
            "\t}\n"
            "}";


    return code;
}